

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O2

void ztparse(void *yyp,int yymajor,ztlexinf_t *yyminor)

{
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  ztast_program_t *pzVar4;
  ztast_assignment_t *pzVar5;
  ztast_intarray_t *pzVar6;
  ztast_intarrayinner_t *pzVar7;
  ztast_statement_t *pzVar8;
  long lVar9;
  char *pcVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte bVar13;
  ulong uVar14;
  double dVar15;
  
  pbVar12 = *yyp;
  puVar2 = *(undefined8 **)((long)yyp + 0x10);
  bVar13 = *pbVar12;
  do {
    if (bVar13 < 0x17) {
      lVar9 = (ulong)"+"[bVar13] + ((ulong)(uint)yymajor & 0xff);
      pbVar11 = "RRRRRRRRRRRRRRpo_RRcbRR" + bVar13;
      if ("\x19\x1a\x1b\x1c\x1d\x1e\x1f \b\t\x1b\v\f\r\x0e\x0f\t\x11\v\f\r\x06\x0f\a\a\x12\x14\x15\x16\x17\x18\x1b\x10\x10\x1e\x0f !\"\x01\x02\x03\x04"
          [lVar9] == (byte)yymajor) {
        pbVar11 = "\x15[\\]^\x10`\x10=\asCDEF\x03\a\x02CDE5\x0366IS\x05\x05X\x16rGH\x0f\x03\x0f\x12\x11\v\n\t\bU\x04\x04X\x16B\a6CDE\v\n\t\bVWX\x16\x0eT\x0e6M\f\x01\rT\reTed\x13d\x13\x14T\x14TJ\x06\t\b"
                  + lVar9;
      }
      bVar13 = *pbVar11;
    }
    if (bVar13 < 0x55) {
      if (bVar13 < 0x52) {
        *(byte **)yyp = pbVar12 + 0x10;
        if (*(byte **)((long)yyp + 0x658) < pbVar12 + 0x10) {
          *(byte **)yyp = pbVar12;
          yyStackOverflow((yyParser *)yyp);
        }
        else {
          if (0x16 < bVar13) {
            bVar13 = bVar13 + 0x24;
          }
          pbVar12[0x10] = bVar13;
          pbVar12[0x11] = (byte)yymajor;
          *(ztlexinf_t **)(pbVar12 + 0x18) = yyminor;
        }
        *(int *)((long)yyp + 8) = *(int *)((long)yyp + 8) + -1;
        return;
      }
      if (bVar13 == 0x53) {
        *(byte **)yyp = pbVar12 + -0x10;
      }
      else {
        if (*(int *)((long)yyp + 8) < 1) {
          lVar9 = *(long *)((long)yyp + 0x10);
          pcVar10 = *(char **)(lVar9 + 8);
          if (yyminor == (ztlexinf_t *)0x0) {
            builtin_strncpy(pcVar10,"syntax error",0xd);
          }
          else {
            sprintf(pcVar10,"syntax error at line %d column %d",(ulong)(uint)yyminor->line,
                    (ulong)(uint)yyminor->column);
          }
          *(long *)((long)yyp + 0x10) = lVar9;
        }
        *(undefined4 *)((long)yyp + 8) = 3;
        if (yymajor != 0) {
          return;
        }
        pbVar12 = *yyp;
        while ((byte *)((long)yyp + 0x18U) < pbVar12) {
          pbVar12 = pbVar12 + -0x10;
          *(byte **)yyp = pbVar12;
        }
      }
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
      return;
    }
    uVar14 = (ulong)(bVar13 - 0x55);
    switch(uVar14) {
    case 0:
      if (pbVar12 < *(byte **)((long)yyp + 0x658)) {
        pzVar4 = ztast_program((ztast_t *)*puVar2,(ztast_statement_t *)0x0);
        *(ztast_program_t **)(pbVar12 + 0x18) = pzVar4;
        goto switchD_00103993_default;
      }
      yyStackOverflow((yyParser *)yyp);
      pbVar12 = *yyp;
      bVar13 = 0;
      goto LAB_00103c9f;
    case 1:
      pzVar8 = (ztast_statement_t *)
               ztast_program((ztast_t *)*puVar2,*(ztast_statement_t **)(pbVar12 + 8));
      break;
    case 2:
      ztast_statement_append
                ((ztast_t *)*puVar2,*(ztast_statement_t **)(pbVar12 + -8),
                 *(ztast_statement_t **)(pbVar12 + 8));
      goto switchD_00103993_default;
    case 3:
      pzVar8 = ztast_statement_from_assignment
                         ((ztast_t *)*puVar2,*(ztast_assignment_t **)(pbVar12 + 8));
      break;
    case 4:
      pzVar5 = ztast_assignment((ztast_t *)*puVar2,*(ztast_id_t **)(pbVar12 + -0x28),
                                *(ztast_expr_t **)(pbVar12 + -8));
      *(ztast_assignment_t **)(pbVar12 + -0x28) = pzVar5;
      goto switchD_00103993_default;
    case 5:
      pzVar8 = (ztast_statement_t *)
               ztast_id((ztast_t *)*puVar2,(char *)(*(long *)(pbVar12 + 8) + 0xc));
      break;
    case 6:
      pzVar8 = (ztast_statement_t *)
               ztast_expr_from_value((ztast_t *)*puVar2,*(ztast_value_t **)(pbVar12 + 8));
      break;
    case 7:
      pzVar8 = (ztast_statement_t *)
               ztast_expr_from_scope((ztast_t *)*puVar2,*(ztast_scope_t **)(pbVar12 + 8));
      break;
    case 8:
      pzVar8 = (ztast_statement_t *)
               ztast_expr_from_intarray((ztast_t *)*puVar2,*(ztast_intarray_t **)(pbVar12 + 8));
      break;
    case 9:
      pzVar8 = (ztast_statement_t *)
               ztast_expr_from_scopearray((ztast_t *)*puVar2,*(ztast_scopearray_t **)(pbVar12 + 8));
      break;
    case 10:
      pzVar8 = (ztast_statement_t *)
               ztast_value_from_integer((ztast_t *)*puVar2,*(int *)(pbVar12 + 8));
      break;
    case 0xb:
      pzVar8 = (ztast_statement_t *)
               ztast_value_from_decimal((ztast_t *)*puVar2,*(int *)(pbVar12 + 8));
      break;
    case 0xc:
      pzVar8 = (ztast_statement_t *)ztast_value_nil((ztast_t *)*puVar2);
      break;
    case 0xd:
      *(int *)(pbVar12 + -0x18) = *(int *)(pbVar12 + -0x18) + *(int *)(pbVar12 + 8);
      goto switchD_00103993_default;
    case 0xe:
      *(int *)(pbVar12 + -0x18) = *(int *)(pbVar12 + -0x18) - *(int *)(pbVar12 + 8);
      goto switchD_00103993_default;
    case 0xf:
      iVar3 = *(int *)(pbVar12 + 8) * *(int *)(pbVar12 + -0x18);
      goto LAB_00103af5;
    case 0x10:
      iVar3 = *(int *)(pbVar12 + -0x18) / *(int *)(pbVar12 + 8);
      goto LAB_00103af5;
    case 0x11:
      iVar3 = *(int *)(pbVar12 + -8);
LAB_00103af5:
      *(int *)(pbVar12 + -0x18) = iVar3;
      goto switchD_00103993_default;
    case 0x12:
      iVar3 = atoi((char *)(*(long *)(pbVar12 + 8) + 0xc));
      goto LAB_00103b78;
    case 0x13:
      pcVar10 = (char *)(*(long *)(pbVar12 + 8) + 0xd);
      goto LAB_00103be8;
    case 0x14:
      pcVar10 = (char *)(*(long *)(pbVar12 + 8) + 0xe);
LAB_00103be8:
      lVar9 = strtol(pcVar10,(char **)0x0,0x10);
      *(int *)(pbVar12 + 8) = (int)lVar9;
      goto switchD_00103993_default;
    case 0x15:
      dVar15 = atof((char *)(*(long *)(pbVar12 + 8) + 0xc));
      iVar3 = (int)(dVar15 * 100.0);
LAB_00103b78:
      *(int *)(pbVar12 + 8) = iVar3;
      goto switchD_00103993_default;
    case 0x16:
      pzVar6 = (ztast_intarray_t *)ztast_scope((ztast_t *)*puVar2,(ztast_statement_t *)0x0);
      goto LAB_00103bd8;
    case 0x17:
      pzVar7 = (ztast_intarrayinner_t *)
               ztast_scope((ztast_t *)*puVar2,*(ztast_statement_t **)(pbVar12 + -8));
      goto LAB_00103c1f;
    case 0x18:
      pzVar6 = ztast_intarray((ztast_t *)*puVar2,(ztast_intarrayinner_t *)0x0);
LAB_00103bd8:
      *(ztast_intarray_t **)(pbVar12 + -8) = pzVar6;
      goto switchD_00103993_default;
    case 0x19:
      pzVar7 = (ztast_intarrayinner_t *)
               ztast_intarray((ztast_t *)*puVar2,*(ztast_intarrayinner_t **)(pbVar12 + -8));
      goto LAB_00103c1f;
    case 0x1a:
      pzVar8 = (ztast_statement_t *)
               ztast_intarrayinner_append
                         ((ztast_t *)*puVar2,(ztast_intarrayinner_t *)0x0,*(int *)(pbVar12 + 8));
      break;
    case 0x1b:
      pzVar7 = ztast_intarrayinner_append
                         ((ztast_t *)*puVar2,*(ztast_intarrayinner_t **)(pbVar12 + -0x18),
                          *(int *)(pbVar12 + 8));
      goto LAB_00103c1f;
    case 0x1c:
      pzVar7 = (ztast_intarrayinner_t *)
               ztast_scopearray((ztast_t *)*puVar2,*(ztast_scopearrayinner_t **)(pbVar12 + -8));
      goto LAB_00103c1f;
    case 0x1d:
      pzVar8 = (ztast_statement_t *)
               ztast_scopearrayinner_append
                         ((ztast_t *)*puVar2,(ztast_scopearrayinner_t *)0x0,
                          *(ztast_scope_t **)(pbVar12 + 8));
      break;
    case 0x1e:
      pzVar7 = (ztast_intarrayinner_t *)
               ztast_scopearrayinner_append
                         ((ztast_t *)*puVar2,*(ztast_scopearrayinner_t **)(pbVar12 + -0x18),
                          *(ztast_scope_t **)(pbVar12 + 8));
LAB_00103c1f:
      *(ztast_intarrayinner_t **)(pbVar12 + -0x18) = pzVar7;
    default:
      goto switchD_00103993_default;
    }
    *(ztast_statement_t **)(pbVar12 + 8) = pzVar8;
switchD_00103993_default:
    bVar1 = "\x14\x14\x15\x16\x17\x18\x19\x19\x19\x19\x1a\x1a\x1a\x1e\x1e\x1e\x1e\x1e   \x1f\x1b\x1b\x1c\x1c!!\x1d\"\"\x15\x1e"
            [uVar14];
    pbVar11 = pbVar12 + (long)""[uVar14] * 0x10;
    pbVar12 = pbVar11 + 0x10;
    bVar13 = "\x15[\\]^\x10`\x10=\asCDEF\x03\a\x02CDE5\x0366IS\x05\x05X\x16rGH\x0f\x03\x0f\x12\x11\v\n\t\bU\x04\x04X\x16B\a6CDE\v\n\t\bVWX\x16\x0eT\x0e6M\f\x01\rT\reTed\x13d\x13\x14T\x14TJ\x06\t\b"
             [(long)yy_reduce_ofst[*pbVar11] + (ulong)bVar1];
    *(byte **)yyp = pbVar12;
    *pbVar12 = bVar13;
    pbVar11[0x11] = bVar1;
LAB_00103c9f:
    if (pbVar12 <= (byte *)((long)yyp + 0x18U)) {
      return;
    }
  } while( true );
}

Assistant:

void ztparse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  ztparseTOKENTYPE yyminor       /* The value for the token */
  ztparseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  YYACTIONTYPE yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser = (yyParser*)yyp;  /* The parser */
  ztparseCTX_FETCH
  ztparseARG_STORE

  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif

  yyact = yypParser->yytos->stateno;
#ifndef NDEBUG
  if( yyTraceFILE ){
    if( yyact < YY_MIN_REDUCE ){
      fprintf(yyTraceFILE,"%sInput '%s' in state %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact);
    }else{
      fprintf(yyTraceFILE,"%sInput '%s' with pending reduce %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact-YY_MIN_REDUCE);
    }
  }
#endif

  do{
    assert( yyact==yypParser->yytos->stateno );
    yyact = yy_find_shift_action((YYCODETYPE)yymajor,yyact);
    if( yyact >= YY_MIN_REDUCE ){
      yyact = yy_reduce(yypParser,yyact-YY_MIN_REDUCE,yymajor,
                        yyminor ztparseCTX_PARAM);
    }else if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,(YYCODETYPE)yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      break;
    }else if( yyact==YY_ACCEPT_ACTION ){
      yypParser->yytos--;
      yy_accept(yypParser);
      return;
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) > YY_MAX_SHIFTREDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
      if( yymajor==YYNOCODE ) break;
      yyact = yypParser->yytos->stateno;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      break;
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      break;
#endif
    }
  }while( yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
  }
#endif
  return;
}